

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_file.c
# Opt level: O2

int GetNormal(Edge *e,double *v1,double *v2)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  double dVar3;
  double dVar4;
  
  auVar2._0_8_ = v2[1] - v1[1];
  e->a = auVar2._0_8_;
  dVar3 = *v2 - *v1;
  e->b = -dVar3;
  dVar4 = SQRT(auVar2._0_8_ * auVar2._0_8_ + dVar3 * dVar3);
  if (dVar4 < 1.0) {
    return 1;
  }
  auVar2._8_8_ = -dVar3;
  auVar1._8_8_ = dVar4;
  auVar1._0_8_ = dVar4;
  auVar2 = divpd(auVar2,auVar1);
  e->a = (double)auVar2._0_8_;
  e->b = (double)auVar2._8_8_;
  e->c = -(auVar2._0_8_ * *v1 + auVar2._8_8_ * v1[1]);
  return 0;
}

Assistant:

int GetNormal(struct Edge *e, double *v1, double *v2)
{
   /* get line normal */
   double length;

   e->a = v2[1] - v1[1];
   e->b = -(v2[0] - v1[0]);

   /* make line normal unit length */
   length = sqrt(e->a * e->a + e->b * e->b);
   if (length < 1.0f)
      return true;
   e->a /= length;
   e->b /= length;

   /* calculate distance of line from origin */
   e->c = -(v1[0] * e->a + v1[1] * e->b);
   return false;
}